

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O2

int cjne_indir_rx_imm_offset(em8051 *aCPU)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uchar *puVar4;
  ulong uVar5;
  byte bVar6;
  
  puVar4 = aCPU->mLowerData;
  uVar5 = (long)aCPU->mCodeMemSize - 1;
  bVar1 = aCPU->mSFR[0x50];
  bVar6 = puVar4[bVar1 & 0x18 | aCPU->mCodeMem[uVar5 & (long)aCPU->mPC] & 1];
  bVar2 = aCPU->mCodeMem[(long)(int)uVar5 & (long)aCPU->mPC + 1U];
  if ((char)bVar6 < '\0') {
    puVar4 = aCPU->mUpperData;
    if (puVar4 == (uchar *)0x0) {
      bVar6 = 0x77;
      goto LAB_001089c5;
    }
    bVar6 = bVar6 & 0x7f;
  }
  bVar6 = puVar4[bVar6];
LAB_001089c5:
  aCPU->mSFR[0x50] = (bVar6 < bVar2) << 7 | bVar1 & 0x7f;
  if (bVar6 == bVar2) {
    iVar3 = aCPU->mPC;
  }
  else {
    iVar3 = (int)(char)aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 2U] +
            aCPU->mPC;
  }
  aCPU->mPC = iVar3 + 3;
  return 1;
}

Assistant:

static int cjne_indir_rx_imm_offset(struct em8051 *aCPU)
{
    int address = INDIR_RX_ADDRESS;
    int value1 = BAD_VALUE;
    int value2 = OPERAND1;
    if (address > 0x7f)
    {
        if (aCPU->mUpperData)
        {
            value1 = aCPU->mUpperData[address - 0x80];
        }
    }
    else
    {
        value1 = aCPU->mLowerData[address];
    }  

    if (value1 < value2)
    {
        PSW |= PSWMASK_C;
    }
    else
    {
        PSW &= ~PSWMASK_C;
    }

    if (value1 != value2)
    {
        PC += (signed char)OPERAND2 + 3;
    }
    else
    {
        PC += 3;
    }
    return 1;
}